

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tls-client.c
# Opt level: O2

int lws_ssl_client_connect2(lws *wsi,char *errbuf,size_t len)

{
  lws_ssl_capable_status lVar1;
  int iVar2;
  lws_usec_t lVar3;
  
  if ((short)wsi->wsistate == 0x204) {
    lVar1 = lws_tls_client_connect(wsi,errbuf,len);
    _lws_log(0x10,"%s: SSL_connect says %d\n","lws_ssl_client_connect2",(ulong)(uint)lVar1);
    switch(lVar1) {
    case LWS_SSL_CAPABLE_MORE_SERVICE_WRITE:
      lws_callback_on_writable(wsi);
    case LWS_SSL_CAPABLE_MORE_SERVICE_READ:
      lwsi_set_state(wsi,0x204);
    case LWS_SSL_CAPABLE_MORE_SERVICE:
      lVar1 = LWS_SSL_CAPABLE_DONE;
      break;
    case LWS_SSL_CAPABLE_ERROR:
      break;
    default:
      goto switchD_0013384a_default;
    }
  }
  else {
switchD_0013384a_default:
    iVar2 = lws_tls_client_confirm_peer_cert(wsi,errbuf,len);
    if (iVar2 == 0) {
      lVar3 = lws_now_usecs();
      (wsi->conmon).ciu_tls = (int)lVar3 - (int)wsi->conmon_datum;
      lVar1 = ~LWS_SSL_CAPABLE_MORE_SERVICE_READ;
    }
    else {
      lVar1 = LWS_SSL_CAPABLE_ERROR;
    }
  }
  return lVar1;
}

Assistant:

int
lws_ssl_client_connect2(struct lws *wsi, char *errbuf, size_t len)
{
	int n;

	if (lwsi_state(wsi) == LRS_WAITING_SSL) {
		n = lws_tls_client_connect(wsi, errbuf, len);
		lwsl_debug("%s: SSL_connect says %d\n", __func__, n);

		switch (n) {
		case LWS_SSL_CAPABLE_ERROR:
			// lws_snprintf(errbuf, len, "client connect failed");
			return -1;
		case LWS_SSL_CAPABLE_DONE:
			break; /* connected */
		case LWS_SSL_CAPABLE_MORE_SERVICE_WRITE:
			lws_callback_on_writable(wsi);
			/* fallthru */
		case LWS_SSL_CAPABLE_MORE_SERVICE_READ:
			lwsi_set_state(wsi, LRS_WAITING_SSL);
			/* fallthru */
		case LWS_SSL_CAPABLE_MORE_SERVICE:
			return 0; /* retry */
		}
	}

	if (lws_tls_client_confirm_peer_cert(wsi, errbuf, len)) {
		lws_metrics_caliper_report(wsi->cal_conn, METRES_NOGO);
		return -1;
	}

	lws_metrics_caliper_report(wsi->cal_conn, METRES_GO);
#if defined(LWS_WITH_CONMON)
	wsi->conmon.ciu_tls = (lws_conmon_interval_us_t)
					(lws_now_usecs() - wsi->conmon_datum);
#endif

	return 1; /* connected */
}